

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# like_optimizations.cpp
# Opt level: O3

void __thiscall
duckdb::LikeOptimizationRule::LikeOptimizationRule
          (LikeOptimizationRule *this,ExpressionRewriter *rewriter)

{
  _Head_base<0UL,_duckdb::FunctionMatcher_*,_false> _Var1;
  _Head_base<0UL,_duckdb::ExpressionMatcher_*,_false> _Var2;
  _Head_base<0UL,_duckdb::FunctionExpressionMatcher_*,_false> _Var3;
  pointer pFVar4;
  _Head_base<0UL,_duckdb::FunctionMatcher_*,_false> _Var5;
  long lVar6;
  _Head_base<0UL,_duckdb::FunctionExpressionMatcher_*,_false> local_e0;
  undefined1 local_d3;
  undefined1 local_d2;
  undefined1 local_d1;
  __uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>
  local_d0 [2];
  undefined1 local_c0 [16];
  undefined1 *local_b0 [2];
  undefined1 local_a0 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_90;
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  local_58;
  
  (this->super_Rule).rewriter = rewriter;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl = (ExpressionMatcher *)0x0
  ;
  (this->super_Rule)._vptr_Rule = (_func_int **)&PTR__Rule_02450ce0;
  local_e0._M_head_impl = (FunctionExpressionMatcher *)operator_new(0x48);
  ((local_e0._M_head_impl)->super_ExpressionMatcher).expr_class = BOUND_FUNCTION;
  ((local_e0._M_head_impl)->super_ExpressionMatcher).expr_type.
  super_unique_ptr<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionTypeMatcher,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionTypeMatcher_*,_std::default_delete<duckdb::ExpressionTypeMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionTypeMatcher_*,_false>._M_head_impl =
       (ExpressionTypeMatcher *)0x0;
  ((local_e0._M_head_impl)->super_ExpressionMatcher).type.
  super_unique_ptr<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::TypeMatcher,_std::default_delete<duckdb::TypeMatcher>_>._M_t.
  super__Tuple_impl<0UL,_duckdb::TypeMatcher_*,_std::default_delete<duckdb::TypeMatcher>_>.
  super__Head_base<0UL,_duckdb::TypeMatcher_*,_false>._M_head_impl = (TypeMatcher *)0x0;
  ((local_e0._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher =
       (_func_int **)&PTR__FunctionExpressionMatcher_024716b8;
  ((local_e0._M_head_impl)->matchers).
  super_vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  ((local_e0._M_head_impl)->matchers).
  super_vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ((local_e0._M_head_impl)->matchers).
  super_vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  .
  super__Vector_base<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ((local_e0._M_head_impl)->function).
  super_unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::FunctionMatcher_*,_std::default_delete<duckdb::FunctionMatcher>_>.
  super__Head_base<0UL,_duckdb::FunctionMatcher_*,_false> =
       (_Head_base<0UL,_duckdb::FunctionMatcher_*,_false>)0x0;
  pFVar4 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_e0);
  local_d0[0]._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl =
       (tuple<duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>)
       operator_new(0x20);
  *(undefined ***)
   local_d0[0]._M_t.
   super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
   .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl =
       &PTR__ExpressionMatcher_02471500;
  *(undefined1 *)
   ((long)local_d0[0]._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
          .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl + 8) = 0;
  *(long *)((long)local_d0[0]._M_t.
                  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
                  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl + 0x10) =
       0;
  *(long *)((long)local_d0[0]._M_t.
                  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
                  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl + 0x18) =
       0;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pFVar4->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)local_d0);
  if ((_Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       )local_d0[0]._M_t.
        super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
        .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl !=
      (ExpressionMatcher *)0x0) {
    (**(code **)(*(long *)local_d0[0]._M_t.
                          super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
                          .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl +
                8))();
  }
  pFVar4 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_e0);
  local_d0[0]._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl =
       (tuple<duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>)
       operator_new(0x20);
  *(undefined1 *)
   ((long)local_d0[0]._M_t.
          super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
          .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl + 8) = 0x1f;
  *(long *)((long)local_d0[0]._M_t.
                  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
                  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl + 0x10) =
       0;
  *(long *)((long)local_d0[0]._M_t.
                  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
                  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl + 0x18) =
       0;
  *(undefined ***)
   local_d0[0]._M_t.
   super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
   .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl =
       &PTR__ExpressionMatcher_02450fc8;
  ::std::
  vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
  ::
  emplace_back<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>
            ((vector<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>,std::allocator<duckdb::unique_ptr<duckdb::ExpressionMatcher,std::default_delete<duckdb::ExpressionMatcher>,true>>>
              *)&pFVar4->matchers,
             (unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>,_true>
              *)local_d0);
  if ((_Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       )local_d0[0]._M_t.
        super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
        .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl !=
      (ExpressionMatcher *)0x0) {
    (**(code **)(*(long *)local_d0[0]._M_t.
                          super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
                          .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl +
                8))();
  }
  pFVar4 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_e0);
  pFVar4->policy = ORDERED;
  local_d0[0]._M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl =
       (tuple<duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>)local_c0
  ;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_d0,"!~~","");
  local_b0[0] = local_a0;
  ::std::__cxx11::string::_M_construct<char_const*>((string *)local_b0,"~~","");
  ::std::
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::_Hashtable<std::__cxx11::string_const*>
            ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)&local_90,local_d0,&local_90,0,&local_d1,&local_d2,&local_d3);
  _Var5._M_head_impl = (FunctionMatcher *)operator_new(0x40);
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)&local_58,&local_90);
  (_Var5._M_head_impl)->_vptr_FunctionMatcher = (_func_int **)&PTR__ManyFunctionMatcher_02451008;
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                *)(_Var5._M_head_impl + 1),&local_58,&local_58);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_58);
  pFVar4 = unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
           ::operator->((unique_ptr<duckdb::FunctionExpressionMatcher,_std::default_delete<duckdb::FunctionExpressionMatcher>,_true>
                         *)&local_e0);
  _Var1._M_head_impl =
       (pFVar4->function).
       super_unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>._M_t
       .
       super___uniq_ptr_impl<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::FunctionMatcher_*,_std::default_delete<duckdb::FunctionMatcher>_>
       .super__Head_base<0UL,_duckdb::FunctionMatcher_*,_false>._M_head_impl;
  (pFVar4->function).
  super_unique_ptr<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::FunctionMatcher,_std::default_delete<duckdb::FunctionMatcher>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::FunctionMatcher_*,_std::default_delete<duckdb::FunctionMatcher>_>.
  super__Head_base<0UL,_duckdb::FunctionMatcher_*,_false>._M_head_impl = _Var5._M_head_impl;
  if (_Var1._M_head_impl != (FunctionMatcher *)0x0) {
    (*(_Var1._M_head_impl)->_vptr_FunctionMatcher[1])();
  }
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
  ::~_Hashtable(&local_90);
  lVar6 = 0;
  do {
    if (local_a0 + lVar6 != *(undefined1 **)((long)local_b0 + lVar6)) {
      operator_delete(*(undefined1 **)((long)local_b0 + lVar6));
    }
    _Var3._M_head_impl = local_e0._M_head_impl;
    lVar6 = lVar6 + -0x20;
  } while (lVar6 != -0x40);
  local_e0._M_head_impl = (FunctionExpressionMatcher *)0x0;
  _Var2._M_head_impl =
       (this->super_Rule).root.
       super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
       _M_t.
       super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
       .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl;
  (this->super_Rule).root.
  super_unique_ptr<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>._M_t.
  super___uniq_ptr_impl<duckdb::ExpressionMatcher,_std::default_delete<duckdb::ExpressionMatcher>_>.
  _M_t.
  super__Tuple_impl<0UL,_duckdb::ExpressionMatcher_*,_std::default_delete<duckdb::ExpressionMatcher>_>
  .super__Head_base<0UL,_duckdb::ExpressionMatcher_*,_false>._M_head_impl =
       &(_Var3._M_head_impl)->super_ExpressionMatcher;
  if (_Var2._M_head_impl != (ExpressionMatcher *)0x0) {
    (**(code **)((long)(_Var2._M_head_impl)->_vptr_ExpressionMatcher + 8))();
    if (local_e0._M_head_impl != (FunctionExpressionMatcher *)0x0) {
      (*((local_e0._M_head_impl)->super_ExpressionMatcher)._vptr_ExpressionMatcher[1])();
    }
  }
  return;
}

Assistant:

LikeOptimizationRule::LikeOptimizationRule(ExpressionRewriter &rewriter) : Rule(rewriter) {
	// match on a FunctionExpression that has a foldable ConstantExpression
	auto func = make_uniq<FunctionExpressionMatcher>();
	func->matchers.push_back(make_uniq<ExpressionMatcher>());
	func->matchers.push_back(make_uniq<ConstantExpressionMatcher>());
	func->policy = SetMatcher::Policy::ORDERED;
	// we match on LIKE ("~~") and NOT LIKE ("!~~")
	func->function = make_uniq<ManyFunctionMatcher>(unordered_set<string> {"!~~", "~~"});
	root = std::move(func);
}